

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O3

int __thiscall crnlib::qdxt5::init(qdxt5 *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  uchar uVar2;
  uint uVar3;
  dxt_pixel_block *pdVar4;
  undefined1 auVar5 [16];
  undefined4 *puVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  crn_thread_id_t cVar10;
  void *in_RCX;
  undefined1 *puVar11;
  long lVar12;
  uint *puVar13;
  ulong uVar14;
  int iVar15;
  dxt_pixel_block *in_RDX;
  uchar *puVar16;
  uint *low8;
  qdxt5 *pqVar17;
  uint uVar18;
  uint *puVar19;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint x;
  uint uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  uint e;
  uint uVar31;
  ulong uVar32;
  undefined4 uVar33;
  float fVar34;
  float fVar35;
  double dVar36;
  double dVar37;
  undefined4 uVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  color_quad_u8 h;
  color_quad_u8 l;
  uint encoding_hist [8];
  image_u8 debug_img;
  uint c [8];
  color_quad_u8 layout_pixels [64];
  color_quad_u8 chunk_pixels [64];
  hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  selector_hash;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_64c;
  uint *local_648;
  qdxt5 *local_640;
  uint *local_638;
  clusterizer<crnlib::vec<2U,_float>_> *local_630;
  long local_628;
  ulong local_620;
  uint local_614;
  int local_610;
  uint local_60c;
  ulong local_608;
  ulong local_600;
  ulong local_5f8;
  ulong local_5f0;
  uint local_5e8;
  float local_5e4;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5e0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5dc;
  undefined8 local_5d8;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  mip_desc *local_5c8;
  ulong local_5c0;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  uint local_588;
  undefined1 local_580 [16];
  undefined8 local_570;
  ulong local_568;
  ulong local_560;
  ulong local_558;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_550;
  uint *local_548;
  undefined4 *local_540;
  ulong local_538;
  ulong local_530;
  empty_type local_528 [32];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_508 [64];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_408;
  float local_404;
  hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  local_308 [2];
  undefined8 auStack_2c0 [82];
  undefined1 auVar38 [16];
  
  paVar20 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
            ((ulong)ctx & 0xffffffff);
  clear(this);
  cVar10 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar10;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x62d);
  local_630 = &this->m_endpoint_clusterizer;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::reserve
            (&local_630->m_training_vecs,(uint)ctx);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  local_598 = (undefined1  [16])0x0;
  local_588 = 0xf;
  local_580 = (undefined1  [16])0x0;
  local_570._0_4_ = 0;
  local_570._4_4_ = 0;
  local_640 = this;
  if (((this->m_params).m_hierarchical == true) && ((this->m_params).m_num_mips != 0)) {
    uVar18 = this->m_num_blocks;
    paVar20 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)(ulong)uVar18;
    uVar31 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
    if (uVar31 != uVar18) {
      if (uVar31 <= uVar18) {
        if ((this->m_endpoint_clusterizer).m_training_vecs.m_capacity < uVar18) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_630,uVar18,uVar31 + 1 == uVar18,0xc,
                     vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover,false);
          uVar31 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
        }
        auVar5 = _DAT_001a70c0;
        auVar40 = _DAT_001a7020;
        auVar42 = _DAT_001a7010;
        if (uVar18 - uVar31 != 0) {
          uVar14 = (ulong)(uVar18 - uVar31) * 0xc - 0xc;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar14;
          uVar33 = SUB164(auVar44 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
          uVar41 = (undefined4)(uVar14 / 0x180000000);
          auVar38._0_8_ = CONCAT44(uVar41,uVar33);
          auVar38._8_4_ = uVar33;
          auVar38._12_4_ = uVar41;
          auVar39._0_8_ = auVar38._0_8_ >> 3;
          auVar39._8_8_ = auVar38._8_8_ >> 3;
          puVar13 = &(local_630->m_training_vecs).m_p[(ulong)uVar31 + 3].second;
          uVar32 = 0;
          auVar39 = auVar39 ^ _DAT_001a7020;
          do {
            auVar43._8_4_ = (int)uVar32;
            auVar43._0_8_ = uVar32;
            auVar43._12_4_ = (int)(uVar32 >> 0x20);
            auVar44 = (auVar43 | auVar42) ^ auVar40;
            iVar8 = auVar39._4_4_;
            if ((bool)(~(auVar44._4_4_ == iVar8 && auVar39._0_4_ < auVar44._0_4_ ||
                        iVar8 < auVar44._4_4_) & 1)) {
              puVar13[-9] = 0;
            }
            if ((auVar44._12_4_ != auVar39._12_4_ || auVar44._8_4_ <= auVar39._8_4_) &&
                auVar44._12_4_ <= auVar39._12_4_) {
              puVar13[-6] = 0;
            }
            auVar44 = (auVar43 | auVar5) ^ auVar40;
            iVar15 = auVar44._4_4_;
            if (iVar15 <= iVar8 && (iVar15 != iVar8 || auVar44._0_4_ <= auVar39._0_4_)) {
              puVar13[-3] = 0;
              *puVar13 = 0;
            }
            uVar32 = uVar32 + 4;
            puVar13 = puVar13 + 0xc;
          } while ((uVar14 / 0xc + 4 & 0xfffffffffffffffc) != uVar32);
        }
      }
      (this->m_endpoint_clusterizer).m_training_vecs.m_size = uVar18;
      local_5a8 = (undefined1  [16])0x0;
      local_5b8 = (undefined1  [16])0x0;
      if ((this->m_params).m_num_mips == 0) goto LAB_0014130b;
    }
    local_5a8 = (undefined1  [16])0x0;
    local_5b8 = (undefined1  [16])0x0;
    local_5c8 = (this->m_params).m_mip_desc;
    local_614 = 0x200;
    local_550 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&DAT_001d3674;
    uVar14 = 0;
    local_60c = 0;
    do {
      local_638 = (uint *)(uVar14 * 3);
      uVar9 = local_5c8[uVar14].m_block_width;
      local_600 = (ulong)local_5c8[uVar14].m_block_height;
      local_5e8 = uVar9 + 1;
      uVar31 = local_5e8 >> 1;
      uVar18 = local_5c8[uVar14].m_block_height + 1;
      paVar20 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)(ulong)uVar18;
      local_64c.m_u32 = 0xff000000;
      local_5f8 = uVar14;
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_598,uVar31 * 8,
                 (uVar18 >> 1) * 8,0xffffffff,(color_quad<unsigned_char,_int> *)&local_64c.field_0);
      if (1 < uVar18) {
        local_638 = &local_5c8->m_first_block + (long)local_638;
        local_600 = (ulong)((int)local_600 * 4 - 1);
        uVar14 = (ulong)(uVar9 * 4 - 1);
        local_5e4 = (float)(local_5f8 & 0xffffffff);
        local_568 = (ulong)(uVar18 >> 1);
        local_558 = (ulong)uVar31;
        local_608 = 0;
        local_610 = 0;
        uVar32 = 0;
        local_620 = uVar14;
        do {
          local_560 = uVar32;
          if (1 < local_5e8) {
            local_538 = (ulong)(uint)((int)uVar32 * 8);
            local_530 = (ulong)(uint)((int)uVar32 * 2);
            local_5f0 = 0;
            iVar8 = 0;
            uVar32 = 0;
            do {
              uVar9 = *local_638;
              uVar3 = local_638[1];
              pdVar4 = this->m_pBlocks;
              paVar20 = &local_408;
              lVar12 = 0;
              do {
                uVar18 = (int)local_538 + (int)lVar12;
                if ((uint)local_600 <= uVar18) {
                  uVar18 = (uint)local_600;
                }
                lVar28 = 0;
                do {
                  uVar31 = (int)lVar28 + iVar8;
                  if ((uint)uVar14 <= uVar31) {
                    uVar31 = (uint)uVar14;
                  }
                  *(undefined4 *)(paVar20->c + lVar28 * 4) =
                       *(undefined4 *)
                        ((long)&pdVar4[(uVar31 >> 2) + (uVar18 >> 2) * uVar3 + uVar9].m_pixels[0]
                                [uVar31 & 3].field_0 + (ulong)((uVar18 & 3) << 4));
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 8);
                lVar12 = lVar12 + 1;
                paVar20 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                          (paVar20->c + 0x20);
              } while (lVar12 != 8);
              puVar19 = &local_308[0].m_values.m_size;
              local_628 = 0;
              local_5c0 = uVar32;
              do {
                local_648 = (uint *)(local_628 * 5);
                uVar18 = (&DAT_001d3908)[local_628 * 5];
                iVar15 = (&DAT_001d390c)[local_628 * 5];
                if (iVar15 != 0) {
                  uVar31 = (&g_chunk_tile_layouts)[local_628 * 5] +
                           (&DAT_001d3904)[local_628 * 5] * 8;
                  uVar21 = 0;
                  iVar23 = 0;
                  uVar14 = (ulong)uVar18;
                  uVar30 = uVar31;
                  uVar24 = uVar21;
                  do {
                    for (; uVar14 != 0; uVar14 = uVar14 - 1) {
                      local_508[uVar21] =
                           *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                            (local_408.c + (ulong)uVar31 * 4);
                      uVar21 = uVar21 + 1;
                      uVar31 = uVar31 + 1;
                    }
                    iVar23 = iVar23 + 1;
                    uVar21 = uVar24 + uVar18;
                    uVar31 = uVar30 + 8;
                    uVar14 = (ulong)uVar18;
                    uVar30 = uVar31;
                    uVar24 = uVar21;
                  } while (iVar23 != iVar15);
                }
                uVar18 = iVar15 * uVar18;
                lVar12 = local_628 * 0x50;
                low8 = (uint *)((long)local_308 + lVar12);
                dxt_fast::compress_alpha_block
                          (uVar18,(color_quad_u8 *)&local_508[0].field_0,low8,
                           (uint *)((long)local_308 + lVar12 + 4),
                           (uint8 *)((long)local_308 + lVar12 + 8),(this->m_params).m_comp_index);
                local_648 = low8;
                dxt5_block::get_block_values
                          ((uint *)local_528,*low8,*(uint *)((long)local_308 + lVar12 + 4));
                if (uVar18 == 0) {
                  lVar12 = 0;
                }
                else {
                  uVar14 = 0;
                  lVar12 = 0;
                  do {
                    lVar12 = lVar12 + (ulong)(((uint)local_508[0].c
                                                     [uVar14 * 4 +
                                                      (ulong)(this->m_params).m_comp_index] -
                                              *(int *)(local_528 +
                                                      (ulong)*(byte *)((long)puVar19 + uVar14) * 4))
                                             * ((uint)local_508[0].c
                                                      [uVar14 * 4 +
                                                       (ulong)(this->m_params).m_comp_index] -
                                               *(int *)(local_528 +
                                                       (ulong)*(byte *)((long)puVar19 + uVar14) * 4)
                                               ));
                    uVar14 = uVar14 + 1;
                  } while (uVar18 != uVar14);
                }
                *(long *)(local_648 + 0x12) = lVar12;
                local_628 = local_628 + 1;
                puVar19 = puVar19 + 0x14;
              } while (local_628 != 9);
              uVar14 = 0;
              puVar19 = (uint *)0xbff0000000000000;
              uVar32 = 0;
              paVar20 = local_550;
              auVar42 = _DAT_001abe00;
              do {
                local_628 = uVar14 * 0x54;
                uVar33 = 0;
                uVar41 = 0x412e847e;
                local_648 = puVar19;
                if ((ulong)(uint)(&g_chunk_encodings)[uVar14 * 0x15] != 0) {
                  dVar37 = 0.0;
                  lVar12 = 0;
                  do {
                    uVar1 = auStack_2c0[(ulong)*(uint *)((long)&(paVar20->field_0).r + lVar12) * 10]
                    ;
                    auVar40._8_4_ = (int)((ulong)uVar1 >> 0x20);
                    auVar40._0_8_ = uVar1;
                    auVar40._12_4_ = 0x45300000;
                    dVar37 = dVar37 + (auVar40._8_8_ - auVar42._8_8_) +
                                      ((double)CONCAT44(0x43300000,(int)uVar1) - auVar42._0_8_);
                    lVar12 = lVar12 + 0x14;
                  } while ((ulong)(uint)(&g_chunk_encodings)[uVar14 * 0x15] * 0x14 != lVar12);
                  dVar37 = dVar37 * 0.015625;
                  if (dVar37 < 0.0) {
                    local_5d8 = dVar37;
                    dVar36 = sqrt(dVar37);
                    auVar42 = _DAT_001abe00;
                    dVar37 = local_5d8;
                  }
                  else {
                    dVar36 = SQRT(dVar37);
                  }
                  uVar33 = 0;
                  uVar41 = 0x412e847e;
                  if ((dVar37 != 0.0) || (NAN(dVar37))) {
                    dVar37 = log10(255.0 / dVar36);
                    dVar37 = dVar37 * 20.0;
                    dVar36 = 500.0;
                    if (dVar37 <= 500.0) {
                      dVar36 = dVar37;
                    }
                    uVar29 = ~-(ulong)(dVar37 < 0.0) & (ulong)dVar36;
                    uVar33 = (undefined4)uVar29;
                    uVar41 = (undefined4)(uVar29 >> 0x20);
                    auVar42 = _DAT_001abe00;
                  }
                }
                fVar35 = 2.4;
                if (local_5f8 != 0) {
                  local_5d8 = (double)CONCAT44(uVar41,uVar33);
                  uStack_5d0 = 0;
                  uStack_5cc = 0;
                  fVar34 = powf(3.0,local_5e4);
                  auVar42 = _DAT_001abe00;
                  uVar33 = (undefined4)local_5d8;
                  uVar41 = local_5d8._4_4_;
                  fVar35 = 0.25;
                  if (0.25 <= 2.4 / fVar34) {
                    fVar35 = 2.4 / fVar34;
                  }
                }
                dVar37 = (double)CONCAT44(uVar41,uVar33) -
                         (double)(((float)(*(int *)((long)&g_chunk_encodings + local_628) - 1) / 3.0
                                  ) * fVar35 + 0.0);
                puVar19 = local_648;
                if ((double)local_648 < dVar37) {
                  uVar32 = uVar14 & 0xffffffff;
                  puVar19 = (uint *)dVar37;
                }
                uVar14 = uVar14 + 1;
                paVar20 = paVar20 + 0x15;
              } while (uVar14 != 8);
              *(int *)(local_5b8 + uVar32 * 4) = *(int *)(local_5b8 + uVar32 * 4) + 1;
              uVar14 = local_620;
              if ((&g_chunk_encodings)[uVar32 * 0x15] != 0) {
                local_540 = &DAT_001d3664 + uVar32 * 0x15;
                dVar37 = 0.0;
                local_548 = &g_chunk_encodings + uVar32 * 0x15;
                do {
                  puVar6 = local_540;
                  uVar32 = (ulong)(uint)local_540[(long)dVar37 * 5 + 4];
                  paVar20 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                            (uVar32 * 0x50);
                  local_5d8 = dVar37;
                  dxt5_block::get_block_values
                            ((uint *)local_528,*(uint *)((long)local_308 + (long)paVar20),
                             *(uint *)((long)local_308 + uVar32 * 0x50 + 4));
                  uVar14 = local_620;
                  puVar13 = puVar6 + (long)dVar37 * 5;
                  uVar18 = puVar13[3];
                  if (uVar18 == 0) {
                    uVar31 = puVar13[2];
                    uVar18 = 0;
                  }
                  else {
                    uVar31 = puVar13[2];
                    iVar23 = 0;
                    uVar21 = 0;
                    iVar15 = local_610;
                    uVar30 = uVar31;
                    do {
                      uVar24 = 0;
                      if (uVar30 != 0) {
                        uVar18 = puVar13[1];
                        uVar24 = 0;
                        uVar31 = uVar30;
                        do {
                          uVar30 = *puVar13;
                          uVar2 = local_408.c
                                  [(ulong)(this->m_params).m_comp_index +
                                   (ulong)(iVar23 + uVar18 * 8 + uVar24 + uVar30) * 4];
                          uVar29 = (ulong)(uVar31 * uVar21 + uVar24);
                          local_508[0].c[uVar29 * 4] = uVar2;
                          local_508[0].c[uVar29 * 4 + 1] = uVar2;
                          local_508[0].c[uVar29 * 4 + 2] = uVar2;
                          local_508[0].c[uVar29 * 4 + 3] = 0xff;
                          uVar31 = *(uint *)(local_528 +
                                            (ulong)*(byte *)((long)local_308 +
                                                            uVar29 + uVar32 * 0x50 + 8) * 4);
                          paVar20 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                                    (ulong)uVar31;
                          uVar26 = uVar31;
                          if (0xfe < uVar31) {
                            uVar26 = 0xff;
                          }
                          uVar30 = uVar30 + iVar8 + uVar24 + local_598._8_4_ * (uVar18 + iVar15);
                          uVar2 = (uchar)uVar26;
                          if ((int)uVar31 < 0) {
                            uVar2 = '\0';
                          }
                          (((color_quad<unsigned_char,_int> *)(local_580._0_8_ + (ulong)uVar30 * 4))
                          ->field_0).field_0.r = uVar2;
                          (((color_quad<unsigned_char,_int> *)(local_580._0_8_ + (ulong)uVar30 * 4))
                          ->field_0).field_0.g = uVar2;
                          (((color_quad<unsigned_char,_int> *)(local_580._0_8_ + (ulong)uVar30 * 4))
                          ->field_0).field_0.b = uVar2;
                          (((color_quad<unsigned_char,_int> *)(local_580._0_8_ + (ulong)uVar30 * 4))
                          ->field_0).field_0.a = 0xff;
                          uVar24 = uVar24 + 1;
                          uVar31 = puVar13[2];
                          this = local_640;
                        } while (uVar24 < uVar31);
                        uVar18 = puVar13[3];
                        uVar24 = uVar31;
                      }
                      uVar21 = uVar21 + 1;
                      iVar23 = iVar23 + 8;
                      iVar15 = iVar15 + 1;
                      uVar30 = uVar24;
                    } while (uVar21 < uVar18);
                  }
                  dxt_fast::find_representative_colors
                            (uVar31 * uVar18,(color_quad_u8 *)&local_508[0].field_0,
                             (color_quad_u8 *)&local_5dc.field_0,(color_quad_u8 *)&local_5e0.field_0
                            );
                  iVar15 = (uint)local_5dc.field_0.r - (uint)local_5e0.field_0.r;
                  uVar31 = iVar15 * iVar15;
                  uVar18 = uVar31 >> 3;
                  if (7 < uVar18) {
                    uVar18 = 8;
                  }
                  if (uVar31 < 8) {
                    uVar18 = 1;
                  }
                  uVar31 = puVar13[3];
                  if (3 < uVar31) {
                    uVar21 = puVar13[1] >> 2;
                    local_648 = (uint *)(ulong)uVar21;
                    uVar30 = local_638[2];
                    local_628 = CONCAT44(local_628._4_4_,uVar30);
                    iVar15 = (int)local_608 + uVar21;
                    uVar24 = 0;
                    do {
                      if ((uVar24 + (int)local_530 + uVar21 < uVar30) && (3 < puVar13[2])) {
                        uVar25 = puVar13[2] >> 2;
                        uVar26 = local_638[1];
                        paVar20 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                                  (local_630->m_training_vecs).m_p;
                        uVar27 = (*puVar13 >> 2) + (int)local_5f0;
                        do {
                          if (uVar26 <= uVar27) break;
                          uVar14 = (ulong)(uVar26 * iVar15 + uVar27 + *local_638);
                          paVar20[uVar14 * 3] =
                               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                               (float)local_5dc._0_1_;
                          (&paVar20->field_0)[uVar14 * 3 + 1] =
                               (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                                )(float)local_5e0._0_1_;
                          *(uint *)(paVar20->c + uVar14 * 0xc + 8) = uVar18;
                          local_60c = local_60c + 1;
                          uVar27 = uVar27 + 1;
                          uVar25 = uVar25 - 1;
                        } while (uVar25 != 0);
                      }
                      uVar24 = uVar24 + 1;
                      iVar15 = iVar15 + 1;
                      uVar14 = local_620;
                    } while (uVar24 != uVar31 >> 2);
                  }
                  dVar37 = (double)((long)local_5d8 + 1);
                } while ((ulong)dVar37 < (ulong)*local_548);
              }
              if (local_614 <= local_60c) {
                bVar7 = update_progress(this,local_60c,this->m_num_blocks - 1);
                if (!bVar7) goto LAB_00141ec2;
                local_614 = local_614 + 0x200;
              }
              uVar32 = local_5c0 + 1;
              iVar8 = iVar8 + 8;
              local_5f0 = (ulong)((int)local_5f0 + 2);
            } while (uVar32 != local_558);
          }
          uVar32 = local_560 + 1;
          local_610 = local_610 + 8;
          local_608 = (ulong)((int)local_608 + 2);
        } while (uVar32 != local_568);
      }
      uVar14 = local_5f8 + 1;
    } while (uVar14 < (this->m_params).m_num_mips);
  }
  else {
    uVar14 = (ulong)this->m_num_blocks;
    if (this->m_num_blocks != 0) {
      lVar12 = 0;
      paVar20 = &local_408;
      uVar32 = 0;
      do {
        if (((uVar32 & 0x1ff) == 0) &&
           (bVar7 = update_progress(local_640,(uint)uVar32,(int)uVar14 - 1), !bVar7))
        goto LAB_00141ec2;
        puVar16 = local_640->m_pBlocks->m_pixels[0][0].field_0.c +
                  (ulong)(local_640->m_params).m_comp_index + lVar12;
        lVar28 = 0;
        puVar11 = (undefined1 *)((long)&local_308[0].m_values.m_p + 3);
        do {
          lVar22 = 0;
          do {
            uVar2 = puVar16[lVar22 * 4];
            puVar11[lVar22 * 4 + -3] = uVar2;
            puVar11[lVar22 * 4 + -2] = uVar2;
            puVar11[lVar22 * 4 + -1] = uVar2;
            puVar11[lVar22 * 4] = 0xff;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          lVar28 = lVar28 + 1;
          puVar16 = puVar16 + 0x10;
          puVar11 = puVar11 + 0x10;
        } while (lVar28 != 4);
        dxt_fast::find_representative_colors
                  (0x10,(color_quad_u8 *)local_308,(color_quad_u8 *)&local_508[0].field_0,
                   (color_quad_u8 *)local_5b8);
        local_408 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                    (float)(byte)local_508[0]._0_1_;
        iVar8 = (uint)(byte)local_508[0]._0_1_ - (uint)(byte)local_5b8[0];
        uVar18 = iVar8 * iVar8;
        uVar9 = uVar18 >> 3;
        if (7 < uVar9) {
          uVar9 = 8;
        }
        if (uVar18 < 8) {
          uVar9 = 1;
        }
        local_404 = (float)(byte)local_5b8[0];
        clusterizer<crnlib::vec<2U,_float>_>::add_training_vec
                  (local_630,(vec<2U,_float> *)&paVar20->field_0,uVar9);
        uVar32 = uVar32 + 1;
        uVar14 = (ulong)local_640->m_num_blocks;
        lVar12 = lVar12 + 0x40;
      } while (uVar32 < uVar14);
    }
  }
LAB_0014130b:
  pqVar17 = local_640;
  pqVar17->m_progress_start = 0x4b;
  pqVar17->m_progress_range = 0x14;
  bVar7 = clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
                    (local_630,0xffff,generate_codebook_progress_callback,local_640,false);
  if (bVar7) {
    local_308[0].m_values.m_p = (raw_node *)0x0;
    local_308[0].m_values.m_size = 0;
    local_308[0].m_values.m_capacity = 0;
    local_308[0].m_hash_shift = 0x20;
    local_308[0].m_num_valid = 0;
    local_308[0].m_grow_threshold = 0;
    pqVar17->m_progress_start = 0x5f;
    pqVar17->m_progress_range = 5;
    uVar14 = (ulong)pqVar17->m_num_blocks;
    if (pqVar17->m_num_blocks == 0) {
      uVar9 = 0x80;
    }
    else {
      uVar32 = 0;
      paVar20 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)local_5b8;
      do {
        if (((uVar32 & 0x1ff) == 0) &&
           (bVar7 = update_progress(local_640,(uint)uVar32,(int)uVar14 - 1), !bVar7)) {
          iVar8 = 0;
          goto LAB_00141f0a;
        }
        dxt_fast::compress_alpha_block
                  ((dxt5_block *)&local_508[0].field_0,
                   (color_quad_u8 *)(local_640->m_pBlocks + uVar32),
                   (local_640->m_params).m_comp_index);
        lVar12 = 0;
        uVar14 = 0;
        puVar16 = &local_508[0].field_0.b;
        do {
          uVar14 = uVar14 | (ulong)*puVar16 << ((byte)lVar12 & 0x3f);
          puVar16 = puVar16 + 1;
          lVar12 = lVar12 + 8;
        } while (lVar12 != 0x30);
        local_5b8._0_8_ = uVar14;
        hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
        ::insert((insert_result *)&local_408.field_0,local_308,(unsigned_long_long *)paVar20->c,
                 local_528);
        uVar32 = uVar32 + 1;
        uVar14 = (ulong)local_640->m_num_blocks;
      } while (uVar32 < uVar14);
      uVar9 = local_308[0].m_num_valid + 0x80;
      pqVar17 = local_640;
    }
    pqVar17->m_max_selector_clusters = uVar9;
    iVar8 = (int)CONCAT71((int7)((ulong)paVar20 >> 8),1);
    update_progress(pqVar17,1,1);
LAB_00141f0a:
    if (local_308[0].m_values.m_size == 0) {
      if (local_308[0].m_values.m_p != (raw_node *)0x0) {
        crnlib_free(local_308[0].m_values.m_p);
      }
    }
    else if (local_308[0].m_values.m_p != (raw_node *)0x0) {
      crnlib_free(local_308[0].m_values.m_p);
    }
  }
  else {
LAB_00141ec2:
    iVar8 = 0;
  }
  if ((color_quad<unsigned_char,_int> *)local_580._8_8_ != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free((void *)local_580._8_8_);
  }
  return iVar8;
}

Assistant:

bool qdxt5::init(uint n, const dxt_pixel_block* pBlocks, const qdxt5_params& params)
    {
        clear();

        CRNLIB_ASSERT(n && pBlocks);

        m_main_thread_id = crn_get_current_thread_id();

        m_num_blocks = n;
        m_pBlocks = pBlocks;
        m_params = params;

        m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

        m_progress_start = 0;
        m_progress_range = 75;

        image_u8 debug_img;

        const bool debugging = true;

        if ((m_params.m_hierarchical) && (m_params.m_num_mips))
        {
            vec2F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
            training_vecs.resize(m_num_blocks);

            uint encoding_hist[cNumChunkEncodings];
            utils::zero_object(encoding_hist);

            uint total_processed_blocks = 0;
            uint next_progress_threshold = 512;

            for (uint level = 0; level < m_params.m_num_mips; level++)
            {
                const qdxt5_params::mip_desc& level_desc = m_params.m_mip_desc[level];

                const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
                const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

                const uint level_width = level_desc.m_block_width * 4;
                const uint level_height = level_desc.m_block_height * 4;

                if (debugging)
                {
                    debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);
                }

                for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++)
                {
                    for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++)
                    {
                        color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

                        for (uint y = 0; y < cChunkPixelHeight; y++)
                        {
                            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

                            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

                            for (uint x = 0; x < cChunkPixelWidth; x++)
                            {
                                const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

                                const uint block_index = outer_block_index + (pix_x >> 2);

                                const dxt_pixel_block& block = m_pBlocks[block_index];

                                const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

                                chunk_pixels[x + y * 8] = p;
                            }
                        }

                        struct layout_results
                        {
                            uint m_low_color;
                            uint m_high_color;
                            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
                            uint64 m_error;
                            //float m_penalty;
                        };
                        layout_results layouts[cNumChunkTileLayouts];

                        for (uint l = 0; l < cNumChunkTileLayouts; l++)
                        {
                            const uint width = g_chunk_tile_layouts[l].m_width;
                            const uint height = g_chunk_tile_layouts[l].m_height;
                            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
                            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

                            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
                            for (uint y = 0; y < height; y++)
                            {
                                for (uint x = 0; x < width; x++)
                                {
                                    layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];
                                }
                            }

                            const uint n = width * height;
                            dxt_fast::compress_alpha_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors, m_params.m_comp_index);

                            uint c[dxt5_block::cMaxSelectorValues];
                            dxt5_block::get_block_values(c, layouts[l].m_low_color, layouts[l].m_high_color);

                            uint64 error = 0;
                            for (uint i = 0; i < n; i++)
                            {
                                error += math::square((int)layout_pixels[i][m_params.m_comp_index] - (int)c[layouts[l].m_selectors[i]]);
                            }

                            layouts[l].m_error = error;
                        }

                        double best_peak_snr = -1.0f;
                        uint best_encoding = 0;

                        for (uint e = 0; e < cNumChunkEncodings; e++)
                        {
                            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

                            double total_error = 0;

                            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            {
                                total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;
                            }

                            double mean_squared = total_error * (1.0f / 64.0f);
                            double root_mean_squared = sqrt(mean_squared);

                            double peak_snr = 999999.0f;
                            if (mean_squared)
                            {
                                peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);
                            }

                            float adaptive_tile_alpha_psnr_derating = 2.4f;
                            //if (level)
                            //   adaptive_tile_alpha_psnr_derating = math::lerp(adaptive_tile_alpha_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));
                            if ((level) && (adaptive_tile_alpha_psnr_derating > .25f))
                            {
                                adaptive_tile_alpha_psnr_derating = math::maximum(.25f, adaptive_tile_alpha_psnr_derating / powf(3.0f, static_cast<float>(level)));
                            }

                            float alpha_derating = math::lerp(0.0f, adaptive_tile_alpha_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
                            peak_snr = peak_snr - alpha_derating;

                            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

                            if (peak_snr > best_peak_snr)
                            {
                                best_peak_snr = peak_snr;
                                best_encoding = e;
                            }
                        }

                        encoding_hist[best_encoding]++;

                        const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

                        for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                        {
                            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

                            uint layout_index = tile_desc.m_layout_index;
                            const layout_results& layout = layouts[layout_index];

                            uint c[dxt5_block::cMaxSelectorValues];
                            if (debugging)
                            {
                                dxt5_block::get_block_values(c, layout.m_low_color, layout.m_high_color);
                            }

                            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

                            for (uint y = 0; y < tile_desc.m_height; y++)
                            {
                                const uint pix_y = y + tile_desc.m_y_ofs;

                                for (uint x = 0; x < tile_desc.m_width; x++)
                                {
                                    const uint pix_x = x + tile_desc.m_x_ofs;

                                    uint a = chunk_pixels[pix_x + pix_y * cChunkPixelWidth][m_params.m_comp_index];

                                    tile_pixels[x + y * tile_desc.m_width].set(a, a, a, 255);

                                    if (debugging)
                                    {
                                        debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
                                    }
                                }
                            }

                            color_quad_u8 l, h;
                            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

                            const uint dist = math::square<int>((int)l[0] - (int)h[0]);

                            const int cAlphaErrorToWeight = 8;
                            const uint cMaxWeight = 8;
                            uint weight = math::clamp<uint>(dist / cAlphaErrorToWeight, 1, cMaxWeight);

                            vec2F ev;

                            ev[0] = l[0];
                            ev[1] = h[0];

                            for (uint y = 0; y < (tile_desc.m_height >> 2); y++)
                            {
                                uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
                                if (block_y >= level_desc.m_block_height)
                                {
                                    continue;
                                }

                                for (uint x = 0; x < (tile_desc.m_width >> 2); x++)
                                {
                                    uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                                    if (block_x >= level_desc.m_block_width)
                                    {
                                        break;
                                    }

                                    uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                                    training_vecs[block_index].first = ev;
                                    training_vecs[block_index].second = weight;

                                    total_processed_blocks++;

                                } // x
                            } // y
                        } //t

                        if (total_processed_blocks >= next_progress_threshold)
                        {
                            next_progress_threshold += 512;

                            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
                            {
                                return false;
                            }
                        }

                    } // chunk_x
                } // chunk_y

#if QDXT5_DEBUGGING
                if (debugging)
                    image_utils::write_to_file(dynamic_wstring(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

            } // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
        }
        else
        {
            for (uint block_index = 0; block_index < m_num_blocks; block_index++)
            {
                if ((block_index & 511) == 0)
                {
                    if (!update_progress(block_index, m_num_blocks - 1))
                    {
                        return false;
                    }
                }

                color_quad_u8 c[16];
                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        c[x + y * cDXTBlockSize].set(m_pBlocks[block_index].m_pixels[y][x][m_params.m_comp_index], 255);
                    }
                }

                color_quad_u8 l, h;
                dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, c, l, h);

                const uint dist = math::square<int>((int)l[0] - (int)h[0]);

                const int cAlphaErrorToWeight = 8;
                const uint cMaxWeight = 8;
                uint weight = math::clamp<uint>(dist / cAlphaErrorToWeight, 1, cMaxWeight);

                vec2F ev;

                ev[0] = l[0];
                ev[1] = h[0];

                m_endpoint_clusterizer.add_training_vec(ev, weight);
            }
        }

        const uint cMaxEndpointClusters = 65535U;

        m_progress_start = 75;
        m_progress_range = 20;

        if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
        {
            return false;
        }

        crnlib::hash_map<uint64, empty_type> selector_hash;

        m_progress_start = 95;
        m_progress_range = 5;

        for (uint block_index = 0; block_index < m_num_blocks; block_index++)
        {
            if ((block_index & 511) == 0)
            {
                if (!update_progress(block_index, m_num_blocks - 1))
                {
                    return false;
                }
            }

            dxt5_block dxt_blk;
            dxt_fast::compress_alpha_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0], m_params.m_comp_index);

            uint64 selectors = 0;
            for (uint i = 0; i < dxt5_block::cNumSelectorBytes; i++)
            {
                selectors |= static_cast<uint64>(dxt_blk.m_selectors[i]) << (i * 8U);
            }

            selector_hash.insert(selectors);
        }

        m_max_selector_clusters = selector_hash.size() + 128;

        update_progress(1, 1);

        return true;
    }